

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDTypes.cpp
# Opt level: O3

void __thiscall
SWDParser::Setup(SWDParser *this,AnalyzerChannelData *pSWDIO,AnalyzerChannelData *pSWCLK,
                SWDAnalyzer *pAnalyzer)

{
  AnalyzerChannelData *pAVar1;
  int iVar2;
  
  this->mSWDIO = pSWDIO;
  this->mSWCLK = pSWCLK;
  this->mAnalyzer = pAnalyzer;
  iVar2 = AnalyzerChannelData::GetBitState();
  if (iVar2 == 1) {
    AnalyzerChannelData::AdvanceToNextEdge();
    pAVar1 = this->mSWDIO;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar1);
    return;
  }
  return;
}

Assistant:

void SWDParser::Setup( AnalyzerChannelData* pSWDIO, AnalyzerChannelData* pSWCLK, SWDAnalyzer* pAnalyzer )
{
    mSWDIO = pSWDIO;
    mSWCLK = pSWCLK;

    mAnalyzer = pAnalyzer;

    // skip the SWCLK high
    if( mSWCLK->GetBitState() == BIT_HIGH )
    {
        mSWCLK->AdvanceToNextEdge();
        mSWDIO->AdvanceToAbsPosition( mSWCLK->GetSampleNumber() );
    }
}